

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_count_gt.cpp
# Opt level: O1

void __thiscall
ising_dos_square_count_Test::~ising_dos_square_count_Test(ising_dos_square_count_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ising_dos_square, count) {
  auto dos = ising::dos::square::count(4, 4);
  EXPECT_EQ(33, dos.size());
  EXPECT_EQ(2, dos[0]);
  EXPECT_EQ(0, dos[2]);
  EXPECT_EQ(32, dos[4]);
  EXPECT_EQ(64, dos[6]);
  EXPECT_EQ(20524, dos[16]);
  EXPECT_EQ(2, dos[32]);
}